

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::SPPMIntegrator::SPPMIntegrator
          (SPPMIntegrator *this,Camera *camera,Sampler *sampler,Primitive *aggregate,
          vector<pbrt::Light,_std::allocator<pbrt::Light>_> *lights,int photonsPerIteration,
          int maxDepth,Float initialSearchRadius,int seed,RGBColorSpace *colorSpace)

{
  undefined8 *in_RDI;
  int in_R9D;
  undefined4 in_XMM0_Da;
  Bounds2i BVar1;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Sampler *in_stack_ffffffffffffff30;
  Camera *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *__x;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Primitive *in_stack_ffffffffffffffa8;
  Integrator *in_stack_ffffffffffffffb0;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> local_38 [2];
  
  __x = local_38;
  local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_XMM0_Da;
  local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_R9D;
  Primitive::Primitive
            ((Primitive *)in_stack_ffffffffffffff30,
             (Primitive *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::vector
            ((vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)&stack0xffffffffffffffb0,__x);
  Integrator::Integrator
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::~vector
            ((vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  *in_RDI = &PTR__SPPMIntegrator_03743f80;
  Camera::Camera((Camera *)in_stack_ffffffffffffff30,
                 (Camera *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(undefined4 *)(in_RDI + 9) =
       local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  Sampler::Sampler(in_stack_ffffffffffffff30,
                   (Sampler *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(undefined4 *)(in_RDI + 0xb) = in_stack_00000010;
  *(undefined4 *)((long)in_RDI + 0x5c) = in_stack_00000008;
  if (local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ < 1) {
    Camera::GetFilm(in_stack_ffffffffffffff38);
    BVar1 = Film::PixelBounds((Film *)in_stack_ffffffffffffff30);
    local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         Bounds2<int>::Area((Bounds2<int> *)
                            BVar1.pMax.super_Tuple2<pbrt::Point2,_int>.
                            super_Tuple2<pbrt::Point2,_int>);
  }
  *(int *)(in_RDI + 0xc) =
       local_38[0].super__Vector_base<pbrt::Light,_std::allocator<pbrt::Light>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  in_RDI[0xd] = in_stack_00000018;
  return;
}

Assistant:

SPPMIntegrator(Camera camera, Sampler sampler, Primitive aggregate,
                   std::vector<Light> lights, int photonsPerIteration, int maxDepth,
                   Float initialSearchRadius, int seed, const RGBColorSpace *colorSpace)
        : Integrator(aggregate, lights),
          camera(camera),
          samplerPrototype(sampler),
          initialSearchRadius(initialSearchRadius),
          maxDepth(maxDepth),
          photonsPerIteration(photonsPerIteration > 0
                                  ? photonsPerIteration
                                  : camera.GetFilm().PixelBounds().Area()),
          colorSpace(colorSpace),
          digitPermutationsSeed(seed) {}